

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void do_fmlal_idx(float32 *d,void *vn,void *vm,float_status *fpst,uint32_t desc,_Bool fz16)

{
  uint32_t uVar1;
  uint32_t is_2_00;
  uint32_t uVar2;
  float32 xb;
  float32 fVar3;
  uintptr_t opr_sz;
  uintptr_t max_sz;
  float32 n_1;
  float32 m_1;
  uint64_t n_4;
  int is_q;
  int index;
  int is_2;
  int is_s;
  intptr_t oprsz;
  intptr_t i;
  _Bool fz16_local;
  uint32_t desc_local;
  float_status *fpst_local;
  void *vm_local;
  void *vn_local;
  float32 *d_local;
  
  opr_sz = simd_oprsz(desc);
  uVar1 = extract32(desc,10,1);
  is_2_00 = extract32(desc,0xb,1);
  uVar2 = extract32(desc,0xc,3);
  _n_1 = load4_f16((uint64_t *)vn,(uint)(opr_sz == 0x10),is_2_00);
  if (uVar1 != 0) {
    _n_1 = _n_1 ^ 0x8000800080008000;
  }
  xb = float16_to_float32_by_bits((uint)*(ushort *)((long)vm + (long)(int)uVar2 * 2),fz16);
  for (oprsz = 0; oprsz < (long)opr_sz / 4; oprsz = oprsz + 1) {
    fVar3 = float16_to_float32_by_bits((uint32_t)(_n_1 >> ((byte)(oprsz << 4) & 0x3f)),fz16);
    fVar3 = float32_muladd_aarch64(fVar3,xb,d[oprsz],0,fpst);
    d[oprsz] = fVar3;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(d,opr_sz,max_sz);
  return;
}

Assistant:

static void do_fmlal_idx(float32 *d, void *vn, void *vm, float_status *fpst,
                         uint32_t desc, bool fz16)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int is_s = extract32(desc, SIMD_DATA_SHIFT, 1);
    int is_2 = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    int index = extract32(desc, SIMD_DATA_SHIFT + 2, 3);
    int is_q = oprsz == 16;
    uint64_t n_4;
    float32 m_1;

    /* Pre-load all of the f16 data, avoiding overlap issues.  */
    n_4 = load4_f16(vn, is_q, is_2);

    /* Negate all inputs for FMLSL at once.  */
    if (is_s) {
        n_4 ^= 0x8000800080008000ull;
    }

    m_1 = float16_to_float32_by_bits(((float16 *)vm)[H2(index)], fz16);

    for (i = 0; i < oprsz / 4; i++) {
        float32 n_1 = float16_to_float32_by_bits(n_4 >> (i * 16), fz16);
        d[H4(i)] = float32_muladd(n_1, m_1, d[H4(i)], 0, fpst);
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}